

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SlowAppend
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,char *ip,size_t len)

{
  value_type pcVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  ulong in_RDX;
  void *in_RSI;
  value_type *in_RDI;
  size_t bsize;
  size_t avail;
  SnappySinkAllocator *in_stack_ffffffffffffffc0;
  unsigned_long local_38;
  unsigned_long local_30;
  ulong local_28;
  ulong local_20;
  void *local_18;
  
  local_28 = (long)in_RDI[0xb] - (long)in_RDI[10];
  local_20 = in_RDX;
  local_18 = in_RSI;
  while( true ) {
    if (local_20 <= local_28) {
      memcpy(in_RDI[10],local_18,local_20);
      in_RDI[10] = in_RDI[10] + local_20;
      return true;
    }
    memcpy(in_RDI[10],local_18,local_28);
    in_RDI[10] = in_RDI[10] + local_28;
    in_RDI[8] = in_RDI[8] + ((long)in_RDI[10] - (long)in_RDI[9]);
    local_20 = local_20 - local_28;
    local_18 = (void *)(local_28 + (long)local_18);
    if (in_RDI[7] < in_RDI[8] + local_20) break;
    local_38 = (long)in_RDI[7] - (long)in_RDI[8];
    puVar2 = std::min<unsigned_long>(&kBlockSize,&local_38);
    local_30 = *puVar2;
    pcVar3 = SnappySinkAllocator::Allocate(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
    in_RDI[9] = pcVar3;
    in_RDI[10] = in_RDI[9];
    in_RDI[0xb] = in_RDI[9] + local_30;
    pcVar1 = in_RDI[0xb];
    in_stack_ffffffffffffffc0 = (SnappySinkAllocator *)0x3f;
    puVar2 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffc0,&local_30);
    in_RDI[0xc] = pcVar1 + -*puVar2;
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffffc0,in_RDI);
    local_28 = local_30;
  }
  return false;
}

Assistant:

bool SnappyScatteredWriter<Allocator>::SlowAppend(const char* ip, size_t len) {
  size_t avail = op_limit_ - op_ptr_;
  while (len > avail) {
    // Completely fill this block
    std::memcpy(op_ptr_, ip, avail);
    op_ptr_ += avail;
    assert(op_limit_ - op_ptr_ == 0);
    full_size_ += (op_ptr_ - op_base_);
    len -= avail;
    ip += avail;

    // Bounds check
    if (full_size_ + len > expected_) return false;

    // Make new block
    size_t bsize = std::min<size_t>(kBlockSize, expected_ - full_size_);
    op_base_ = allocator_.Allocate(bsize);
    op_ptr_ = op_base_;
    op_limit_ = op_base_ + bsize;
    op_limit_min_slop_ = op_limit_ - std::min<size_t>(kSlopBytes - 1, bsize);

    blocks_.push_back(op_base_);
    avail = bsize;
  }

  std::memcpy(op_ptr_, ip, len);
  op_ptr_ += len;
  return true;
}